

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O2

void __thiscall
CoinSelection_SelectCoins_KnapsackSolver_ApproximateBestSubset_with_asset_Test::TestBody
          (CoinSelection_SelectCoins_KnapsackSolver_ApproximateBestSubset_with_asset_Test *this)

{
  mapped_type_conflict mVar1;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type_conflict *pmVar4;
  char *pcVar5;
  CoinSelectionOption *in_R9;
  Amount AVar6;
  AssertHelper local_190;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar;
  AssertHelper local_150;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  AmountMap map_select_value;
  Amount local_f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  Amount fee;
  AmountMap map_target_amount;
  CoinSelectionOption option;
  
  GetElementsOption();
  cfd::CoinSelectionOption::SetFeeAsset(&option,&exp_dummy_asset_a);
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&map_select_value,&exp_dummy_asset_a);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&map_target_amount,(key_type *)&map_select_value);
  *pmVar3 = 220000000;
  std::__cxx11::string::~string((string *)&map_select_value);
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_select_value._M_t._M_impl.super__Rb_tree_header._M_header;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::Amount::Amount(&fee);
  AVar6 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_f8.amount_ = AVar6.amount_;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8.ignore_check_ = AVar6.ignore_check_;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      GetElementsUtxoList();
      in_R9 = &option;
      cfd::CoinSelection::SelectCoins
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar,&exp_selection,
                 &map_target_amount,(vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar_4,
                 &exp_filter,in_R9,&local_f8,&map_select_value,&fee,&map_searched_bnb,
                 (AmountMap *)0x0);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::_M_move_assign(&ret,&gtest_ar);
      std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
                ((_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar);
      std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
                ((_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar_4);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x3b0,
               "Expected: ret = exp_selection.SelectCoins( map_target_amount, GetElementsUtxoList(), exp_filter, option, tx_fee, &map_select_value, &fee, &map_searched_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  gtest_ar_4._0_8_ =
       ((long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
             super__Vector_impl_data._M_start) / 0xd8;
  local_190.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"ret.size()","2",(unsigned_long *)&gtest_ar_4,(int *)&local_190);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x3b2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if ((long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
            super__Vector_impl_data._M_start == 0xd8) {
    gtest_ar_4.success_ = true;
    gtest_ar_4._1_7_ = 0x9502f;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&gtest_ar,"ret[0].amount","static_cast<int64_t>(156250000)",
               &(ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                 super__Vector_impl_data._M_start)->amount,(long *)&gtest_ar_4);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_4);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x3b4,pcVar5);
      testing::internal::AssertHelper::operator=(&local_190,(Message *)&gtest_ar_4);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_4);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_4.success_ = true;
    gtest_ar_4._1_7_ = 0x4a817;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&gtest_ar,"ret[1].amount","static_cast<int64_t>(78125000)",
               &ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                super__Vector_impl_data._M_start[1].amount,(long *)&gtest_ar_4);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_4);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x3b5,pcVar5);
      testing::internal::AssertHelper::operator=(&local_190,(Message *)&gtest_ar_4);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_4);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  gtest_ar_4._0_8_ = map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_190.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"map_select_value.size()","1",(unsigned_long *)&gtest_ar_4,
             (int *)&local_190);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x3b7,pcVar5);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_dummy_asset_a);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&map_select_value,(key_type *)&gtest_ar);
    local_190.data_._0_4_ = 0xdf84758;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar_4,"map_select_value[exp_dummy_asset_a.GetHex()]","234375000",
               pmVar3,(int *)&local_190);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_4.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x3b9,pcVar5);
      testing::internal::AssertHelper::operator=(&local_190,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
  }
  gtest_ar_4._0_8_ = cfd::core::Amount::GetSatoshiValue(&fee);
  local_190.data_._0_4_ = 0xe10;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"fee.GetSatoshiValue()","3600",(long *)&gtest_ar_4,
             (int *)&local_190);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x3bb,pcVar5);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_4._0_8_ = map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_190.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"map_searched_bnb.size()","1",(unsigned_long *)&gtest_ar_4,
             (int *)&local_190);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x3bc,pcVar5);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_dummy_asset_a);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&map_searched_bnb,(key_type *)&gtest_ar);
    mVar1 = *pmVar4;
    gtest_ar_4._0_8_ = CONCAT71(gtest_ar_4._1_7_,mVar1) ^ 1;
    gtest_ar_4.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (mVar1 != false) {
      testing::Message::Message((Message *)&local_190);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_4,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","true","false",
                 &in_R9->use_bnb_);
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x3be,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_190);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
  }
  std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
            (&ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree(&map_searched_bnb._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&map_select_value._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&map_target_amount._M_t);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&option.fee_asset_);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_KnapsackSolver_ApproximateBestSubset_with_asset)
{
  CoinSelectionOption option = GetElementsOption();
  option.SetFeeAsset(exp_dummy_asset_a);
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 220000000;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      map_target_amount, GetElementsUtxoList(), exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb));

  EXPECT_EQ(ret.size(), 2);
  if (ret.size() == 1) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(156250000));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(78125000));
  }
  EXPECT_EQ(map_select_value.size(), 1);
  if (map_select_value.size() == 1) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 234375000);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 3600);
  EXPECT_EQ(map_searched_bnb.size(), 1);
  if (map_searched_bnb.size() == 1) {
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
  }
}